

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutValue
          (ConfidentialTransaction *this,uint32_t index,Amount *value)

{
  long lVar1;
  pointer pCVar2;
  ulong uVar3;
  void *pvVar4;
  CfdException *pCVar5;
  undefined4 in_register_00000034;
  size_t __size;
  long lVar6;
  allocator local_91;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  undefined1 local_78 [32];
  ConfidentialValue ct_value;
  
  uVar3 = (ulong)index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x8d6,"SetTxOutValue");
  pvVar4 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (pvVar4 == (void *)0x0) {
    return;
  }
  lVar6 = uVar3 * 0x70 + *(long *)((long)pvVar4 + 0x20);
  ConfidentialValue::ConfidentialValue
            (&ct_value,
             &(this->vout_).
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].confidential_value_);
  if (ct_value.version_ < 2) {
    lVar1 = *(long *)(lVar6 + 0x38);
    ConfidentialValue::~ConfidentialValue(&ct_value);
    if (lVar1 != 0x21) {
      ConfidentialValue::ConfidentialValue(&ct_value,value);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                 &ct_value.data_.data_);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
                         (ByteData *)local_78);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
      pvVar4 = *(void **)(lVar6 + 0x30);
      __size = *(size_t *)(lVar6 + 0x38);
      if (__size != (long)local_90._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_90._M_impl.super__Vector_impl_data._M_start) {
        free(pvVar4);
        __size = (long)local_90._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_90._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = malloc(__size);
        *(void **)(lVar6 + 0x30) = pvVar4;
        if (pvVar4 == (void *)0x0) {
          local_78._0_8_ = "cfdcore_elements_transaction.cpp";
          local_78._8_4_ = 0x8ea;
          local_78._16_8_ = "SetTxOutValue";
          logger::warn<>((CfdSourceLocation *)local_78,"malloc fail.");
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string((string *)local_78,"malloc fail.",&local_91);
          CfdException::CfdException(pCVar5,kCfdMemoryFullError,(string *)local_78);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        *(size_t *)(lVar6 + 0x38) = __size;
      }
      memcpy(pvVar4,local_90._M_impl.super__Vector_impl_data._M_start,__size);
      pCVar2 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*pCVar2[uVar3].super_AbstractTxOut._vptr_AbstractTxOut[2])(pCVar2 + uVar3,value);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
      ConfidentialValue::~ConfidentialValue(&ct_value);
      return;
    }
  }
  else {
    ConfidentialValue::~ConfidentialValue(&ct_value);
  }
  ct_value._vptr_ConfidentialValue = (_func_int **)0x4b5368;
  ct_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8de;
  ct_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetTxOutValue";
  logger::warn<>((CfdSourceLocation *)&ct_value,"value is already blinded.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&ct_value,"value is already blinded.",(allocator *)local_78);
  CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&ct_value);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetTxOutValue(
    uint32_t index, const Amount &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    struct wally_tx_output *output = tx_pointer->outputs + index;
    if (vout_[index].GetConfidentialValue().HasBlinding() ||
        (output->value_len == kConfidentialDataSize)) {
      warn(CFD_LOG_SOURCE, "value is already blinded.");
      throw CfdException(kCfdIllegalStateError, "value is already blinded.");
    }

    ConfidentialValue ct_value(value);
    const std::vector<uint8_t> &value_data = ct_value.GetData().GetBytes();
    if (output->value_len == value_data.size()) {
      memcpy(output->value, value_data.data(), output->value_len);
    } else {
      if (output->value != nullptr) free(output->value);
      output->value = (unsigned char *)malloc(value_data.size());
      if (output->value == nullptr) {
        warn(CFD_LOG_SOURCE, "malloc fail.");
        throw CfdException(kCfdMemoryFullError, "malloc fail.");
      }
      output->value_len = value_data.size();
      memcpy(output->value, value_data.data(), output->value_len);
    }

    vout_[index].SetValue(value);
    // CallbackStateChange(kStateChangeAddTxOut);
  }
}